

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ActivationParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_activation(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x82) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x82;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    ActivationParams::ActivationParams(this_00.activation_);
    (this->layer_).activation_ = (ActivationParams *)this_00;
  }
  return (ActivationParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ActivationParams* NeuralNetworkLayer::mutable_activation() {
  if (!has_activation()) {
    clear_layer();
    set_has_activation();
    layer_.activation_ = new ::CoreML::Specification::ActivationParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.activation)
  return layer_.activation_;
}